

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_ast.cpp
# Opt level: O0

optional<lambda::Parse_ast> * __thiscall
lambda::parse_from::helper::maybe_parse_term
          (optional<lambda::Parse_ast> *__return_storage_ptr__,helper *this)

{
  int iVar1;
  string local_1f8;
  Variable local_1d8;
  Parse_ast local_1b8;
  Parse_ast local_188;
  Parse_ast local_158;
  Parse_ast local_128;
  undefined1 local_f8 [8];
  Parse_ast fst;
  string local_98;
  Lambda local_78;
  undefined1 local_40 [8];
  string name;
  int_type ch;
  helper *this_local;
  
  eat_whitespace(this);
  name.field_2._12_4_ = std::istream::peek();
  if (name.field_2._12_4_ != -1) {
    if (name.field_2._12_4_ == 0x28) {
      std::istream::get();
      iVar1 = std::istream::peek();
      if (iVar1 == 0x2a) {
        std::istream::get();
        comment(this);
        maybe_parse_term(__return_storage_ptr__,this);
        return __return_storage_ptr__;
      }
      parse_term((Parse_ast *)local_f8,this);
      get_close_paren(this);
      lambda::Parse_ast::Parse_ast(&local_158,(Parse_ast *)local_f8);
      parse_from(std::istream&)::helper::parse_app_list(lambda::Parse_ast_
                (&local_128,this,&local_158);
      std::optional<lambda::Parse_ast>::optional<lambda::Parse_ast,_true>
                (__return_storage_ptr__,&local_128);
      lambda::Parse_ast::~Parse_ast(&local_128);
      lambda::Parse_ast::~Parse_ast(&local_158);
      lambda::Parse_ast::~Parse_ast((Parse_ast *)local_f8);
      return __return_storage_ptr__;
    }
    if (name.field_2._12_4_ != 0x29) {
      if ((name.field_2._12_4_ == 0x2f) || (name.field_2._12_4_ == 0x5c)) {
        std::istream::get();
        parse_from(std::istream&)::helper::get_var_abi_cxx11_((string *)local_40,this);
        get_dot(this);
        std::__cxx11::string::string((string *)&local_98,(string *)local_40);
        parse_term((Parse_ast *)
                   ((long)&fst.underlying_.
                           super__Variant_base<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                           .
                           super__Move_assign_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                           .
                           super__Copy_assign_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                           .
                           super__Move_ctor_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                           .
                           super__Copy_ctor_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                   + 0x28),this);
        lambda::Parse_ast::Lambda::Lambda
                  (&local_78,&local_98,
                   (Parse_ast *)
                   ((long)&fst.underlying_.
                           super__Variant_base<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                           .
                           super__Move_assign_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                           .
                           super__Copy_assign_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                           .
                           super__Move_ctor_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                           .
                           super__Copy_ctor_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                   + 0x28));
        std::optional<lambda::Parse_ast>::optional<lambda::Parse_ast::Lambda,_true>
                  (__return_storage_ptr__,&local_78);
        lambda::Parse_ast::Lambda::~Lambda(&local_78);
        lambda::Parse_ast::~Parse_ast
                  ((Parse_ast *)
                   ((long)&fst.underlying_.
                           super__Variant_base<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                           .
                           super__Move_assign_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                           .
                           super__Copy_assign_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                           .
                           super__Move_ctor_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                           .
                           super__Copy_ctor_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                   + 0x28));
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)local_40);
        return __return_storage_ptr__;
      }
      iVar1 = isalpha(name.field_2._12_4_);
      if ((iVar1 == 0) && (name.field_2._12_4_ != 0x5f)) {
        unexpected_thing(this);
      }
      parse_from(std::istream&)::helper::get_var_abi_cxx11_(&local_1f8,this);
      lambda::Parse_ast::Variable::Variable(&local_1d8,&local_1f8);
      lambda::Parse_ast::Parse_ast(&local_1b8,&local_1d8);
      parse_from(std::istream&)::helper::parse_app_list(lambda::Parse_ast_
                (&local_188,this,&local_1b8);
      std::optional<lambda::Parse_ast>::optional<lambda::Parse_ast,_true>
                (__return_storage_ptr__,&local_188);
      lambda::Parse_ast::~Parse_ast(&local_188);
      lambda::Parse_ast::~Parse_ast(&local_1b8);
      lambda::Parse_ast::Variable::~Variable(&local_1d8);
      std::__cxx11::string::~string((string *)&local_1f8);
      return __return_storage_ptr__;
    }
  }
  std::optional<lambda::Parse_ast>::optional(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::optional<Parse_ast> maybe_parse_term() {
      eat_whitespace();
      auto ch = inp.peek();
      switch (ch) {
      case eof:
      case ')':
        return std::nullopt;
      case '/':
      case '\\': {
        inp.get();
        auto name = get_var();
        get_dot();
        return Parse_ast::Lambda(std::move(name), parse_term());
      }
      case '(': {
        inp.get();
        if (inp.peek() == '*') {
          inp.get();
          comment();
          return maybe_parse_term();
        }
        auto fst = parse_term();
        get_close_paren();
        return parse_app_list(std::move(fst));
      }
      default:
        if (std::isalpha(ch) or ch == '_') {
          return parse_app_list(Parse_ast::Variable(get_var()));
        } else {
          unexpected_thing();
        }
      }
    }